

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_ParseWithOpts(char *value,char **return_parse_end,cJSON_bool require_null_terminated)

{
  cJSON_bool cVar1;
  size_t sVar2;
  int in_EDX;
  undefined8 *in_RSI;
  uchar *in_RDI;
  error local_error;
  cJSON *item;
  parse_buffer buffer;
  cJSON *item_00;
  cJSON *in_stack_ffffffffffffff90;
  size_t local_68;
  cJSON *local_60;
  parse_buffer local_58;
  int local_1c;
  undefined8 *local_18;
  uchar *local_10;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_58,0,0x38);
  local_60 = (cJSON *)0x0;
  global_error.json = (uchar *)0x0;
  global_error.position = 0;
  if (local_10 != (uchar *)0x0) {
    local_58.content = local_10;
    sVar2 = strlen((char *)local_10);
    local_58.length = sVar2 + 1;
    local_58.offset = 0;
    local_58.hooks.allocate = global_hooks.allocate;
    local_58.hooks.deallocate = global_hooks.deallocate;
    local_58.hooks.reallocate = global_hooks.reallocate;
    local_60 = cJSON_New_Item((internal_hooks *)in_stack_ffffffffffffff90);
    if (local_60 != (cJSON *)0x0) {
      item_00 = local_60;
      buffer_skip_whitespace(&local_58);
      cVar1 = parse_value(item_00,(parse_buffer *)0x1016f6);
      if ((cVar1 != 0) &&
         ((local_1c == 0 ||
          ((buffer_skip_whitespace(&local_58), local_58.offset < local_58.length &&
           (local_58.content[local_58.offset] == '\0')))))) {
        if (local_18 == (undefined8 *)0x0) {
          return local_60;
        }
        *local_18 = local_58.content + local_58.offset;
        return local_60;
      }
    }
  }
  if (local_60 != (cJSON *)0x0) {
    cJSON_Delete(in_stack_ffffffffffffff90);
  }
  if (local_10 != (uchar *)0x0) {
    local_68 = 0;
    if (local_58.offset < local_58.length) {
      local_68 = local_58.offset;
    }
    else if (local_58.length != 0) {
      local_68 = local_58.length - 1;
    }
    if (local_18 != (undefined8 *)0x0) {
      *local_18 = local_10 + local_68;
    }
    global_error.json = local_10;
    global_error.position = local_68;
  }
  return (cJSON *)0x0;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_ParseWithOpts(const char *value, const char **return_parse_end, cJSON_bool require_null_terminated)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    cJSON *item = NULL;

    /* reset error position */
    global_error.json = NULL;
    global_error.position = 0;

    if (value == NULL)
    {
        goto fail;
    }

    buffer.content = (const unsigned char*)value;
    buffer.length = strlen((const char*)value) + sizeof("");
    buffer.offset = 0;
    buffer.hooks = global_hooks;

    item = cJSON_New_Item(&global_hooks);
    if (item == NULL) /* memory fail */
    {
        goto fail;
    }

    if (!parse_value(item, buffer_skip_whitespace(&buffer)))
    {
        /* parse failure. ep is set. */
        goto fail;
    }

    /* if we require null-terminated JSON without appended garbage, skip and then check for a null terminator */
    if (require_null_terminated)
    {
        buffer_skip_whitespace(&buffer);
        if ((buffer.offset >= buffer.length) || buffer_at_offset(&buffer)[0] != '\0')
        {
            goto fail;
        }
    }
    if (return_parse_end)
    {
        *return_parse_end = (const char*)buffer_at_offset(&buffer);
    }

    return item;

fail:
    if (item != NULL)
    {
        cJSON_Delete(item);
    }

    if (value != NULL)
    {
        error local_error;
        local_error.json = (const unsigned char*)value;
        local_error.position = 0;

        if (buffer.offset < buffer.length)
        {
            local_error.position = buffer.offset;
        }
        else if (buffer.length > 0)
        {
            local_error.position = buffer.length - 1;
        }

        if (return_parse_end != NULL)
        {
            *return_parse_end = (const char*)local_error.json + local_error.position;
        }
 
        global_error = local_error;
    }

    return NULL;
}